

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportTryCompileFileGenerator::PopulateProperties
          (cmExportTryCompileFileGenerator *this,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  undefined8 uVar1;
  mapped_type *pmVar2;
  long lVar3;
  cmLocalGenerator *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  pointer prop;
  string *li;
  string *name;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmGeneratorTarget *tgt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string evalResult;
  undefined1 local_b8 [40];
  cmExportTryCompileFileGenerator *local_90;
  ImportPropertyMap *local_88;
  string *local_80;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *local_78;
  cmGeneratorTarget *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_88 = properties;
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_68,target);
  local_80 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = &this->Exports;
  prop = local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_90 = this;
  do {
    if (prop == local_80) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      return;
    }
    cmGeneratorTarget::GetProperty(target,prop);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_88,prop);
    std::__cxx11::string::assign((char *)pmVar2);
    lVar3 = std::__cxx11::string::find((char *)prop,0x467a20);
    if (lVar3 == 0) {
LAB_0034e2aa:
      local_b8._0_8_ = local_b8 + 0x10;
      local_b8._8_8_ = (pointer)0x0;
      local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
      FindTargets(&local_50,local_90,prop,target,(string *)local_b8,emitted);
      std::__cxx11::string::~string((string *)local_b8);
      local_b8._0_8_ = (string *)0x0;
      local_b8._8_8_ = (string *)0x0;
      local_b8._16_8_ = (pointer)0x0;
      cmSystemTools::ExpandListArgument
                (&local_50,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b8,false);
      uVar1 = local_b8._8_8_;
      for (name = (string *)local_b8._0_8_; name != (string *)uVar1; name = name + 1) {
        this_00 = cmGeneratorTarget::GetLocalGenerator(target);
        local_70 = cmLocalGenerator::FindGeneratorTargetToUse(this_00,name);
        if (local_70 != (cmGeneratorTarget *)0x0) {
          pVar4 = std::
                  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  ::_M_insert_unique<cmGeneratorTarget_const*const&>
                            ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                              *)emitted,&local_70);
          if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            push_back(local_78,&local_70);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b8);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      lVar3 = std::__cxx11::string::find((char *)prop,0x47cdbe);
      if (lVar3 == 0) goto LAB_0034e2aa;
      lVar3 = std::__cxx11::string::find((char *)prop,0x45f5be);
      if (lVar3 == 0) goto LAB_0034e2aa;
    }
    prop = prop + 1;
  } while( true );
}

Assistant:

void cmExportTryCompileFileGenerator::PopulateProperties(
  const cmGeneratorTarget* target, ImportPropertyMap& properties,
  std::set<cmGeneratorTarget const*>& emitted)
{
  std::vector<std::string> props = target->GetPropertyKeys();
  for (std::string const& p : props) {

    properties[p] = target->GetProperty(p);

    if (p.find("IMPORTED_LINK_INTERFACE_LIBRARIES") == 0 ||
        p.find("IMPORTED_LINK_DEPENDENT_LIBRARIES") == 0 ||
        p.find("INTERFACE_LINK_LIBRARIES") == 0) {
      std::string evalResult =
        this->FindTargets(p, target, std::string(), emitted);

      std::vector<std::string> depends;
      cmSystemTools::ExpandListArgument(evalResult, depends);
      for (std::string const& li : depends) {
        cmGeneratorTarget* tgt =
          target->GetLocalGenerator()->FindGeneratorTargetToUse(li);
        if (tgt && emitted.insert(tgt).second) {
          this->Exports.push_back(tgt);
        }
      }
    }
  }
}